

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMDocumentImpl::setXmlVersion(DOMDocumentImpl *this)

{
  XMLCh *in_RSI;
  
  setXmlVersion((DOMDocumentImpl *)&this[-1].fChanges,in_RSI);
  return;
}

Assistant:

void DOMDocumentImpl::setXmlVersion(const XMLCh* version){

    // store the static strings, so that comparisons will be faster
    if(version==0)
        fXmlVersion = 0;
    else if(*version==0)
        fXmlVersion = XMLUni::fgZeroLenString;
    else if(XMLString::equals(version, XMLUni::fgVersion1_0))
        fXmlVersion = XMLUni::fgVersion1_0;
    else if(XMLString::equals(version, XMLUni::fgVersion1_1))
        fXmlVersion = XMLUni::fgVersion1_1;
    else
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
}